

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::FileCryptoMetaData::read
          (FileCryptoMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  undefined8 *puVar6;
  int16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  uint local_70;
  TType ftype;
  FileCryptoMetaData *local_68;
  EncryptionAlgorithm *local_60;
  string *local_58;
  string fname;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&fname);
  local_58 = &this->key_metadata;
  local_60 = &this->encryption_algorithm;
  local_70 = 0;
  local_68 = this;
  do {
    __nbytes_00 = &fid;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&fname,&ftype);
    if (ftype == T_STOP) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if ((local_70 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fname);
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__TException_027d2f80;
      *(undefined4 *)(puVar6 + 5) = 1;
      __cxa_throw(puVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (fid == 2) {
      if (ftype != T_STRING) goto LAB_01ee87d8;
      iVar3 = (*this_00->_vptr_TProtocol[0x2b])(this_00,local_58);
      local_68->__isset = (_FileCryptoMetaData__isset)((byte)local_68->__isset | 1);
    }
    else if ((fid == 1) && (ftype == T_STRUCT)) {
      sVar5 = EncryptionAlgorithm::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
      iVar3 = (int)sVar5;
      local_70 = (uint)CONCAT71((int7)((ulong)sVar5 >> 8),1);
    }
    else {
LAB_01ee87d8:
      iVar3 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t FileCryptoMetaData::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_encryption_algorithm = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->encryption_algorithm.read(iprot);
          isset_encryption_algorithm = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->key_metadata);
          this->__isset.key_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_encryption_algorithm)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}